

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext::RpcCallContext
          (RpcCallContext *this,RpcConnectionState *connectionState,AnswerId answerId)

{
  Array<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> local_48;
  AnswerId local_1c;
  RpcConnectionState *pRStack_18;
  AnswerId answerId_local;
  RpcConnectionState *connectionState_local;
  RpcCallContext *this_local;
  
  local_1c = answerId;
  pRStack_18 = connectionState;
  connectionState_local = (RpcConnectionState *)this;
  CallContextHook::CallContextHook(&this->super_CallContextHook);
  kj::Refcounted::Refcounted(&this->super_Refcounted);
  (this->super_CallContextHook)._vptr_CallContextHook = (_func_int **)&PTR_getParams_00d8cce8;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_00d8cd48;
  kj::addRef<capnp::_::RpcSystemBase::RpcConnectionState>((kj *)&this->connectionState,pRStack_18);
  this->answerId = local_1c;
  Capability::Client::CallHints::CallHints(&this->hints);
  this->interfaceId = 0;
  this->methodId = 0;
  this->requestSize = 0;
  kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>::Maybe(&this->request);
  kj::Array<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::Array(&local_48,(void *)0x0);
  ReaderCapabilityTable::ReaderCapabilityTable(&this->paramsCapTable,&local_48);
  kj::Array<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::~Array(&local_48);
  AnyPointer::Reader::Reader(&this->params);
  kj::
  Maybe<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>_>::
  Maybe(&this->response);
  rpc::Return::Builder::Builder(&this->returnMessage,(void *)0x0);
  this->redirectResults = false;
  this->responseSent = false;
  kj::Maybe<kj::Own<kj::PromiseFulfiller<capnp::AnyPointer::Pipeline>,_std::nullptr_t>_>::Maybe
            (&this->tailCallPipelineFulfiller);
  this->receivedFinish = false;
  kj::UnwindDetector::UnwindDetector(&this->unwindDetector);
  return;
}

Assistant:

RpcCallContext(RpcConnectionState& connectionState, AnswerId answerId)
        : connectionState(kj::addRef(connectionState)),
          answerId(answerId),
          interfaceId(0),
          methodId(0),
          requestSize(0),
          paramsCapTable(nullptr),
          returnMessage(nullptr),
          redirectResults(false) {}